

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
          (ArrayWithPreallocation<soul::CompileMessage,_4UL> *this,CompileMessage *item)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CompileMessage *pCVar2;
  pointer pcVar3;
  undefined8 uVar4;
  Category CVar5;
  CompileMessage *pCVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  reserve(this,this->numActive + 1);
  pCVar2 = this->items + this->numActive;
  pCVar6 = this->items + this->numActive;
  paVar7 = &(pCVar6->description).field_2;
  (pCVar6->description)._M_dataplus._M_p = (pointer)paVar7;
  pcVar3 = (item->description)._M_dataplus._M_p;
  paVar1 = &(item->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&(item->description).field_2 + 8);
    paVar7->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(pCVar6->description).field_2 + 8) = uVar4;
  }
  else {
    (pCVar2->description)._M_dataplus._M_p = pcVar3;
    (pCVar2->description).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (pCVar2->description)._M_string_length = (item->description)._M_string_length;
  (item->description)._M_dataplus._M_p = (pointer)paVar1;
  (item->description)._M_string_length = 0;
  (item->description).field_2._M_local_buf[0] = '\0';
  (pCVar2->location).sourceCode.object = (item->location).sourceCode.object;
  (item->location).sourceCode.object = (SourceCodeText *)0x0;
  (pCVar2->location).location.data = (item->location).location.data;
  CVar5 = item->category;
  pCVar2->type = item->type;
  pCVar2->category = CVar5;
  this->numActive = this->numActive + 1;
  return;
}

Assistant:

void push_back (Item&& item)                            { reserve (numActive + 1); new (items + numActive) Item (std::move (item)); ++numActive; }